

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeBrOn(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Id IVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  value_type *ppEVar5;
  uintptr_t uVar6;
  Expression *pEVar7;
  HeapType HVar8;
  ulong uVar9;
  Type TVar10;
  Expression *brOn;
  Type TVar11;
  TranslateToFuzzReader *this_01;
  int iVar12;
  string_view sVar13;
  undefined1 local_70 [8];
  anon_class_16_2_3fee0b3d fixFlowingType;
  Type local_58;
  Type type_local;
  Type local_48;
  Type targetType;
  Type refType;
  Type castType;
  
  local_58.id = type.id;
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar12 = (this->fuzzParams->super_FuzzParams).TRIES;
    local_48.id = 0;
    if (iVar12 < 1) {
      bVar2 = true;
      sVar13 = (string_view)ZEXT816(0);
    }
    else {
      do {
        this_01 = (TranslateToFuzzReader *)&this->random;
        ppEVar5 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (&this->random,&this->funcContext->breakableStack);
        pEVar7 = *ppEVar5;
        sVar13 = (string_view)getTargetName(this_01,pEVar7);
        IVar1 = pEVar7->_id;
        if (IVar1 != BlockId) {
          uVar6 = 0;
        }
        else {
          uVar6 = (pEVar7->type).id;
        }
        if (IVar1 != BlockId && IVar1 != LoopId) {
          wasm::handle_unreachable
                    ("unexpected expr type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0x15f4);
        }
        local_48.id = uVar6;
        if ((uVar6 == 0) || (6 < uVar6 && (uVar6 & 1) == 0)) goto LAB_0013fa59;
        bVar2 = 1 < iVar12;
        iVar12 = iVar12 + -1;
      } while (bVar2);
      iVar12 = 0;
LAB_0013fa59:
      bVar2 = iVar12 < 1;
    }
    if (!bVar2) {
      local_70 = (undefined1  [8])&local_58;
      fixFlowingType.type = (Type *)this;
      if (local_48.id == 0) {
        TVar10 = getReferenceType(this);
        pEVar7 = make(this,TVar10);
        brOn = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
        brOn->_id = BrOnId;
        (brOn->type).id = 0;
        brOn[1].type.id = 0;
        *(undefined8 *)(brOn + 2) = 0;
        *(undefined8 *)(brOn + 3) = 0;
        *(undefined4 *)(brOn + 1) = 0;
        *(string_view *)&brOn[1].type = sVar13;
        brOn[2].type.id = (uintptr_t)pEVar7;
      }
      else {
        fixFlowingType.this = (TranslateToFuzzReader *)sVar13._M_str;
        if ((local_48.id < 7) || ((local_48.id & 1) != 0)) {
          __assert_fail("targetType.isRef()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0x131e,"Expression *wasm::TranslateToFuzzReader::makeBrOn(Type)");
        }
        this_00 = &this->random;
        type_local.id._4_4_ =
             Random::pick<wasm::BrOnOp,wasm::BrOnOp,wasm::BrOnOp>
                       (this_00,BrOnNonNull,BrOnCast,BrOnCastFail);
        refType.id = 0;
        targetType.id = 0;
        if (type_local.id._4_4_ == BrOnCastFail) {
          targetType = getSubType(this,local_48);
          uVar4 = Random::upTo(this_00,5);
          if (uVar4 == 0) {
            refType = getSuperType(this,targetType);
          }
          else {
            refType = getSubType(this,targetType);
          }
          TVar11.id = targetType.id;
          TVar10.id = refType.id;
          if (((refType.id & 3) == 0 && 6 < refType.id) &&
             (uVar4 = Random::upTo(this_00,2), TVar11 = targetType, TVar10.id = refType.id,
             uVar4 == 0)) {
            HVar8 = Type::getHeapType(&refType);
            if (((uint)(0x7c < HVar8.id) * 4 + 3 & (uint)HVar8.id) != 0) goto LAB_0013fd99;
            TVar11 = targetType;
            TVar10.id = HVar8.id | 2;
          }
        }
        else if (type_local.id._4_4_ == BrOnCast) {
          refType = getSubType(this,local_48);
          uVar4 = Random::upTo(this_00,5);
          if (uVar4 == 0) {
            targetType = getSubType(this,refType);
          }
          else {
            targetType = getSuperType(this,refType);
          }
          TVar11.id = targetType.id;
          TVar10.id = refType.id;
          if ((((local_48.id & 3) == 0 && 6 < local_48.id) &&
              (targetType.id < 7 || (targetType.id & 3) != 0)) &&
             (refType.id < 7 || (refType.id & 3) != 0)) {
            uVar4 = Random::upTo(this_00,2);
            if (uVar4 == 0) {
              TVar11.id = (uintptr_t)Type::getHeapType(&targetType);
              uVar3 = (uint)(0x7c < TVar11.id) * 4 + 3 & (uint)TVar11.id;
              TVar10 = refType;
            }
            else {
              TVar10.id = (uintptr_t)Type::getHeapType(&refType);
              uVar3 = (uint)(0x7c < TVar10.id) * 4 + 3 & (uint)TVar10.id;
              TVar11 = targetType;
            }
            if (uVar3 != 0) goto LAB_0013fd99;
          }
        }
        else {
          if (type_local.id._4_4_ != BrOnNonNull) {
            wasm::handle_unreachable
                      ("bad br_on op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0x1350);
          }
          HVar8 = Type::getHeapType(&local_48);
          if ((((this->wasm->features).features & 0x400) == 0) ||
             (uVar4 = Random::upTo(this_00,2), uVar4 != 0)) {
            uVar9 = 2;
          }
          else {
            uVar9 = 0;
          }
          if (((uint)(0x7c < HVar8.id) * 4 + 3 & (uint)HVar8.id) != 0) {
LAB_0013fd99:
            __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                          ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
          }
          TVar11.id = uVar9 | HVar8.id;
          TVar10.id = refType.id;
        }
        refType.id = TVar10.id;
        targetType.id = TVar11.id;
        pEVar7 = make(this,targetType);
        TVar10 = refType;
        brOn = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
        brOn->_id = BrOnId;
        (brOn->type).id = 0;
        brOn[1].type.id = 0;
        *(undefined8 *)(brOn + 2) = 0;
        *(BrOnOp *)(brOn + 1) = type_local.id._4_4_;
        brOn[1].type.id = sVar13._M_len;
        *(TranslateToFuzzReader **)(brOn + 2) = fixFlowingType.this;
        brOn[2].type.id = (uintptr_t)pEVar7;
        *(uintptr_t *)(brOn + 3) = TVar10.id;
      }
      wasm::BrOn::finalize();
      pEVar7 = makeBrOn::anon_class_16_2_3fee0b3d::operator()
                         ((anon_class_16_2_3fee0b3d *)local_70,brOn);
      return pEVar7;
    }
  }
  pEVar7 = makeTrivial(this,local_58);
  return pEVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeBrOn(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  // We need to find a proper target to break to; try a few times. Finding the
  // target is harder than flowing out the proper type, so focus on the target,
  // and fix up the flowing type later. That is, once we find a target to break
  // to, we can then either drop ourselves or wrap ourselves in a block +
  // another value, so that we return the proper thing here (which is done below
  // in fixFlowingType).
  int tries = fuzzParams->TRIES;
  Name targetName;
  Type targetType;
  while (--tries >= 0) {
    auto* target = pick(funcContext->breakableStack);
    targetName = getTargetName(target);
    targetType = getTargetType(target);
    // We can send any reference type, or no value at all, but nothing else.
    if (targetType.isRef() || targetType == Type::none) {
      break;
    }
  }
  if (tries < 0) {
    return makeTrivial(type);
  }

  auto fixFlowingType = [&](Expression* brOn) -> Expression* {
    if (Type::isSubType(brOn->type, type)) {
      // Already of the proper type.
      return brOn;
    }
    if (type == Type::none) {
      // We just need to drop whatever it is.
      return builder.makeDrop(brOn);
    }
    // We need to replace the type with something else. Drop the BrOn if we need
    // to, and append a value with the proper type.
    if (brOn->type != Type::none) {
      brOn = builder.makeDrop(brOn);
    }
    return builder.makeSequence(brOn, make(type));
  };

  // We found something to break to. Figure out which BrOn variants we can
  // send.
  if (targetType == Type::none) {
    // BrOnNull is the only variant that sends no value.
    return fixFlowingType(
      builder.makeBrOn(BrOnNull, targetName, make(getReferenceType())));
  }

  // We are sending a reference type to the target. All other BrOn variants can
  // do that.
  assert(targetType.isRef());
  auto op = pick(BrOnNonNull, BrOnCast, BrOnCastFail);
  Type castType = Type::none;
  Type refType;
  switch (op) {
    case BrOnNonNull: {
      // The sent type is the non-nullable version of the reference, so any ref
      // of that type is ok, nullable or not.
      refType = Type(targetType.getHeapType(), getNullability());
      break;
    }
    case BrOnCast: {
      // The sent type is the heap type we cast to, with the input type's
      // nullability, so the combination of the two must be a subtype of
      // targetType.
      castType = getSubType(targetType);
      // The ref's type must be castable to castType, or we'd not validate. But
      // it can also be a subtype, which will trivially also succeed (so do that
      // more rarely). Pick subtypes rarely, as they make the cast trivial.
      refType = oneIn(5) ? getSubType(castType) : getSuperType(castType);
      if (targetType.isNonNullable()) {
        // And it must have the right nullability for the target, as mentioned
        // above: if the target type is non-nullable then either the ref or the
        // cast types must be.
        if (!refType.isNonNullable() && !castType.isNonNullable()) {
          // Pick one to make non-nullable.
          if (oneIn(2)) {
            refType = Type(refType.getHeapType(), NonNullable);
          } else {
            castType = Type(castType.getHeapType(), NonNullable);
          }
        }
      }
      break;
    }
    case BrOnCastFail: {
      // The sent type is the ref's type, with adjusted nullability (if the cast
      // allows nulls then no null can fail the cast, and what is sent is non-
      // nullable). First, pick a ref type that we can send to the target.
      refType = getSubType(targetType);
      // See above on BrOnCast, but flipped.
      castType = oneIn(5) ? getSuperType(refType) : getSubType(refType);
      // There is no nullability to adjust: if targetType is non-nullable then
      // both refType and castType are as well, as subtypes of it. But we can
      // also allow castType to be nullable (it is not sent to the target).
      if (castType.isNonNullable() && oneIn(2)) {
        castType = Type(castType.getHeapType(), Nullable);
      }
    } break;
    default: {
      WASM_UNREACHABLE("bad br_on op");
    }
  }
  return fixFlowingType(
    builder.makeBrOn(op, targetName, make(refType), castType));
}